

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O3

FT_Error cff_size_select(FT_Size size,FT_ULong strike_index)

{
  undefined8 *puVar1;
  code *pcVar2;
  long lVar3;
  long b_;
  long c_;
  FT_Module pFVar4;
  long lVar5;
  FT_Long a_;
  FT_Long FVar6;
  PSHinter_Service pshinter;
  ulong uVar7;
  
  size[1].face = (FT_Face)strike_index;
  FT_Select_Metrics(size->face,strike_index);
  puVar1 = *(undefined8 **)(size->face[4].bbox.yMin + 0x1358);
  pFVar4 = FT_Get_Module((size->face->driver->root).library,"pshinter");
  if (((pFVar4 != (FT_Module)0x0) && (puVar1 != (undefined8 *)0x0)) &&
     (pcVar2 = (code *)*puVar1, pcVar2 != (code *)0x0)) {
    lVar5 = (*pcVar2)(pFVar4);
    if (lVar5 != 0) {
      lVar3 = size->face[4].bbox.yMin;
      puVar1 = (undefined8 *)size->internal->module_data;
      b_ = *(long *)(lVar3 + 0x6d0);
      (**(code **)(lVar5 + 8))(*puVar1,(size->metrics).x_scale,(size->metrics).y_scale,0,0);
      for (uVar7 = (ulong)*(uint *)(lVar3 + 0xb30); uVar7 != 0; uVar7 = uVar7 - 1) {
        c_ = *(long *)(*(long *)(lVar3 + 0xb30 + uVar7 * 8) + 0x68);
        a_ = (size->metrics).x_scale;
        if (b_ == c_) {
          FVar6 = (size->metrics).y_scale;
        }
        else {
          a_ = FT_MulDiv(a_,b_,c_);
          FVar6 = FT_MulDiv((size->metrics).y_scale,b_,c_);
        }
        (**(code **)(lVar5 + 8))(puVar1[uVar7],a_,FVar6,0,0);
      }
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_size_select( FT_Size   size,
                   FT_ULong  strike_index )
  {
    CFF_Size           cffsize = (CFF_Size)size;
    PSH_Globals_Funcs  funcs;


    cffsize->strike_index = strike_index;

    FT_Select_Metrics( size->face, strike_index );

    funcs = cff_size_get_globals_funcs( cffsize );

    if ( funcs )
    {
      CFF_Face      face     = (CFF_Face)size->face;
      CFF_Font      font     = (CFF_Font)face->extra.data;
      CFF_Internal  internal = (CFF_Internal)size->internal->module_data;

      FT_Long  top_upm  = (FT_Long)font->top_font.font_dict.units_per_em;
      FT_UInt  i;


      funcs->set_scale( internal->topfont,
                        size->metrics.x_scale, size->metrics.y_scale,
                        0, 0 );

      for ( i = font->num_subfonts; i > 0; i-- )
      {
        CFF_SubFont  sub     = font->subfonts[i - 1];
        FT_Long      sub_upm = (FT_Long)sub->font_dict.units_per_em;
        FT_Pos       x_scale, y_scale;


        if ( top_upm != sub_upm )
        {
          x_scale = FT_MulDiv( size->metrics.x_scale, top_upm, sub_upm );
          y_scale = FT_MulDiv( size->metrics.y_scale, top_upm, sub_upm );
        }
        else
        {
          x_scale = size->metrics.x_scale;
          y_scale = size->metrics.y_scale;
        }

        funcs->set_scale( internal->subfonts[i - 1],
                          x_scale, y_scale, 0, 0 );
      }
    }

    return FT_Err_Ok;
  }